

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

Span * __thiscall QSpanCollection::spanAt(QSpanCollection *this,int x,int y)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  Span **ppSVar4;
  int in_EDX;
  int in_ESI;
  const_iterator *in_RDI;
  long in_FS_OFFSET;
  Span *span;
  const_iterator it_x;
  const_iterator it_y;
  const_iterator *in_stack_ffffffffffffff98;
  int *in_stack_ffffffffffffffa8;
  Span *local_40;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::lowerBound
            ((QMap<int,_QMap<int,_QSpanCollection::Span_*>_> *)CONCAT44(in_ESI,in_EDX),
             in_stack_ffffffffffffffa8);
  QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::end
            ((QMap<int,_QMap<int,_QSpanCollection::Span_*>_> *)CONCAT44(in_ESI,in_EDX));
  bVar2 = ::operator==(in_RDI,(const_iterator *)in_stack_ffffffffffffff98);
  if (bVar2) {
    local_40 = (Span *)0x0;
  }
  else {
    QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::const_iterator::operator*
              ((const_iterator *)0x8b0762);
    QMap<int,_QSpanCollection::Span_*>::lowerBound
              ((QMap<int,_QSpanCollection::Span_*> *)CONCAT44(in_ESI,in_EDX),
               in_stack_ffffffffffffffa8);
    QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::const_iterator::operator*
              ((const_iterator *)0x8b0788);
    QMap<int,_QSpanCollection::Span_*>::end
              ((QMap<int,_QSpanCollection::Span_*> *)CONCAT44(in_ESI,in_EDX));
    bVar2 = ::operator==((const_iterator *)in_RDI,in_stack_ffffffffffffff98);
    if (bVar2) {
      local_40 = (Span *)0x0;
    }
    else {
      ppSVar4 = QMap<int,_QSpanCollection::Span_*>::const_iterator::operator*
                          ((const_iterator *)0x8b07bf);
      local_40 = *ppSVar4;
      iVar3 = Span::right(local_40);
      if ((iVar3 < in_ESI) || (iVar3 = Span::bottom(local_40), iVar3 < in_EDX)) {
        local_40 = (Span *)0x0;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_40;
}

Assistant:

QSpanCollection::Span *QSpanCollection::spanAt(int x, int y) const
{
    Index::const_iterator it_y = index.lowerBound(-y);
    if (it_y == index.end())
        return nullptr;
    SubIndex::const_iterator it_x = (*it_y).lowerBound(-x);
    if (it_x == (*it_y).end())
        return nullptr;
    Span *span = *it_x;
    if (span->right() >= x && span->bottom() >= y)
        return span;
    return nullptr;
}